

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool pick_and_place_monster
                (chunk *c,loc_conflict grid,wchar_t depth,_Bool sleep,_Bool group_okay,
                uint8_t origin)

{
  monster_group_info local_38;
  monster_group_info info;
  monster_race *race;
  uint8_t origin_local;
  _Bool group_okay_local;
  _Bool sleep_local;
  wchar_t depth_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  info = (monster_group_info)get_mon_num(depth,c->depth);
  memset(&local_38,0,8);
  if (info == (monster_group_info)0x0) {
    grid_local.x._3_1_ = false;
  }
  else {
    grid_local.x._3_1_ =
         place_new_monster(c,grid,(monster_race *)info,sleep,group_okay,local_38,origin);
  }
  return grid_local.x._3_1_;
}

Assistant:

bool pick_and_place_monster(struct chunk *c, struct loc grid, int depth,
		bool sleep, bool group_okay, uint8_t origin)
{
	/* Pick a monster race, no specified group */
	struct monster_race *race = get_mon_num(depth, c->depth);
	struct monster_group_info info = { 0, 0 };

	if (race) {
		return place_new_monster(c, grid, race, sleep, group_okay, info,
								 origin);
	} else {
		return false;
	}
}